

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::Promise<void>_>::dispose(ArrayBuilder<kj::Promise<void>_> *this)

{
  Promise<void> *pPVar1;
  RemoveConst<kj::Promise<void>_> *pRVar2;
  Promise<void> *pPVar3;
  
  pPVar1 = this->ptr;
  if (pPVar1 != (Promise<void> *)0x0) {
    pRVar2 = this->pos;
    pPVar3 = this->endPtr;
    this->endPtr = (Promise<void> *)0x0;
    this->ptr = (Promise<void> *)0x0;
    this->pos = (RemoveConst<kj::Promise<void>_> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pPVar1,0x10,(long)pRVar2 - (long)pPVar1 >> 4,
               (long)pPVar3 - (long)pPVar1 >> 4,
               ArrayDisposer::Dispose_<kj::Promise<void>,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }